

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButton::setDefaultAction(QToolButton *this,QAction *action)

{
  byte bVar1;
  bool bVar2;
  QToolButtonPrivate *pQVar3;
  QMenu *pQVar4;
  QActionPrivate *pQVar5;
  QAction *in_RSI;
  QToolButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  bool hadMenu;
  QToolButtonPrivate *d;
  QString buttonText;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  ToolButtonPopupMode mode;
  undefined1 checkable;
  char *str;
  QLatin1StringView in_stack_ffffffffffffff28;
  unkbyte9 Var6;
  QLatin1StringView in_stack_ffffffffffffff38;
  QFont *font;
  undefined7 in_stack_ffffffffffffff48;
  QIcon local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  QAction *local_20;
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RSI;
  pQVar3 = d_func((QToolButton *)0x709d68);
  bVar1 = QToolButtonPrivate::hasMenu(in_RDI);
  pQVar3->defaultAction = local_20;
  if (local_20 != (QAction *)0x0) {
    QWidget::actions((QWidget *)in_stack_ffffffffffffff28.m_size);
    bVar2 = QListSpecialMethodsBase<QAction*>::contains<QAction*>
                      ((QListSpecialMethodsBase<QAction_*> *)in_RDI,
                       (QAction **)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    mode = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff1c) ^ 0xff000000;
    QList<QAction_*>::~QList((QList<QAction_*> *)0x709de0);
    if ((mode & 0x1000000) != DelayedPopup) {
      QWidget::addAction((QWidget *)in_RDI,(QAction *)CONCAT44(mode,in_stack_ffffffffffffff18));
    }
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QAction::iconText();
    QActionPrivate::get((QAction *)0x709e4b);
    bVar2 = QString::isEmpty((QString *)0x709e5a);
    str = (char *)in_stack_ffffffffffffff28.m_size;
    if (bVar2) {
      in_stack_ffffffffffffff38 = Qt::Literals::StringLiterals::operator____L1(str,(size_t)in_RDI);
      in_stack_ffffffffffffff28 = Qt::Literals::StringLiterals::operator____L1(str,(size_t)in_RDI);
      QString::replace((QLatin1String *)&local_50,(QLatin1String *)in_stack_ffffffffffffff38.m_size,
                       (CaseSensitivity)in_stack_ffffffffffffff38.m_data);
    }
    QAbstractButton::setText((QAbstractButton *)in_stack_ffffffffffffff28.m_size,(QString *)in_RDI);
    QAction::icon();
    QAbstractButton::setIcon
              ((QAbstractButton *)in_stack_ffffffffffffff28.m_data,
               (QIcon *)in_stack_ffffffffffffff28.m_size);
    Var6 = in_stack_ffffffffffffff28._7_9_;
    QIcon::~QIcon(&local_58);
    QAction::toolTip();
    font = (QFont *)in_stack_ffffffffffffff38.m_data;
    QWidget::setToolTip((QWidget *)in_stack_ffffffffffffff38.m_size,(QString *)((unkuint9)Var6 >> 8)
                       );
    QString::~QString((QString *)0x709f2e);
    QAction::statusTip();
    QWidget::setStatusTip((QWidget *)in_RDI,(QString *)CONCAT44(mode,in_stack_ffffffffffffff18));
    QString::~QString((QString *)0x709f59);
    QAction::whatsThis();
    QWidget::setWhatsThis((QWidget *)in_RDI,(QString *)CONCAT44(mode,in_stack_ffffffffffffff18));
    QString::~QString((QString *)0x709f84);
    pQVar4 = QAction::menu<QMenu*>((QAction *)0x709f91);
    if ((pQVar4 != (QMenu *)0x0) && ((bVar1 & 1) == 0)) {
      setPopupMode((QToolButton *)in_RDI,mode);
    }
    checkable = (undefined1)(mode >> 0x18);
    QAction::isCheckable();
    QAbstractButton::setCheckable((QAbstractButton *)in_RDI,(bool)checkable);
    QAction::isChecked();
    QAbstractButton::setChecked((QAbstractButton *)((unkuint9)Var6 >> 8),SUB91(Var6,0));
    QAction::isEnabled();
    QWidget::setEnabled((QWidget *)((unkuint9)Var6 >> 8),SUB91(Var6,0));
    pQVar5 = QAction::d_func((QAction *)0x70a011);
    if ((*(ushort *)(pQVar5 + 0x188) >> 8 & 1) != 0) {
      QAction::font();
      QWidget::setFont((QWidget *)CONCAT17(bVar1,in_stack_ffffffffffffff48),font);
      QFont::~QFont(local_18);
    }
    QString::~QString((QString *)0x70a069);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolButton::setDefaultAction(QAction *action)
{
    Q_D(QToolButton);
#if QT_CONFIG(menu)
    bool hadMenu = false;
    hadMenu = d->hasMenu();
#endif
    d->defaultAction = action;
    if (!action)
        return;
    if (!actions().contains(action))
        addAction(action);
    QString buttonText = action->iconText();
    // If iconText() is generated from text(), we need to escape any '&'s so they
    // don't turn into shortcuts
    if (QActionPrivate::get(action)->iconText.isEmpty())
        buttonText.replace("&"_L1, "&&"_L1);
    setText(buttonText);
    setIcon(action->icon());
#if QT_CONFIG(tooltip)
    setToolTip(action->toolTip());
#endif
#if QT_CONFIG(statustip)
    setStatusTip(action->statusTip());
#endif
#if QT_CONFIG(whatsthis)
    setWhatsThis(action->whatsThis());
#endif
#if QT_CONFIG(menu)
    if (action->menu() && !hadMenu) {
        // new 'default' popup mode defined introduced by tool bar. We
        // should have changed QToolButton's default instead. Do that
        // in 4.2.
        setPopupMode(QToolButton::MenuButtonPopup);
    }
#endif
    setCheckable(action->isCheckable());
    setChecked(action->isChecked());
    setEnabled(action->isEnabled());
    if (action->d_func()->fontSet)
        setFont(action->font());
}